

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_loader.cpp
# Opt level: O0

XrResult xrCreateActionSet(XrInstance instance,XrActionSetCreateInfo *createInfo,
                          XrActionSet *actionSet)

{
  unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_> *this
  ;
  pointer pXVar1;
  exception *e;
  XrResult local_34;
  LoaderInstance *pLStack_30;
  XrResult result;
  LoaderInstance *loader_instance;
  XrActionSet *actionSet_local;
  XrActionSetCreateInfo *createInfo_local;
  XrInstance instance_local;
  
  loader_instance = (LoaderInstance *)actionSet;
  actionSet_local = (XrActionSet *)createInfo;
  createInfo_local = (XrActionSetCreateInfo *)instance;
  local_34 = ActiveLoaderInstance::Get(&stack0xffffffffffffffd0,"xrCreateActionSet");
  if (XR_ERROR_VALIDATION_FAILURE < local_34) {
    this = LoaderInstance::DispatchTable(pLStack_30);
    pXVar1 = std::
             unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
             ::operator->(this);
    local_34 = (*pXVar1->CreateActionSet)
                         ((XrInstance)createInfo_local,(XrActionSetCreateInfo *)actionSet_local,
                          (XrActionSet *)loader_instance);
  }
  return local_34;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL xrCreateActionSet(
    XrInstance                                  instance,
    const XrActionSetCreateInfo*                createInfo,
    XrActionSet*                                actionSet) XRLOADER_ABI_TRY {
    LoaderInstance* loader_instance;
    XrResult result = ActiveLoaderInstance::Get(&loader_instance, "xrCreateActionSet");
    if (XR_SUCCEEDED(result)) {
        result = loader_instance->DispatchTable()->CreateActionSet(instance, createInfo, actionSet);
    }
    return result;
}